

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_single.h
# Opt level: O2

uintptr_t __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
::page_overflow(LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  uintptr_t *i_atomic;
  progress_guarantee i_progress_guarantee_00;
  __pointer_type i_atomic_00;
  ControlBlock *prev_block;
  
  if (i_progress_guarantee == LfQueue_Throwing) {
    i_atomic_00 = (__pointer_type)
                  basic_default_allocator<65536UL>::allocate_page
                            ((basic_default_allocator<65536UL> *)this);
  }
  else {
    i_progress_guarantee_00 = progress_blocking;
    if (i_progress_guarantee != LfQueue_Blocking) {
      i_progress_guarantee_00 = i_progress_guarantee == LfQueue_LockFree ^ progress_wait_free;
    }
    i_atomic_00 = (__pointer_type)
                  basic_default_allocator<65536UL>::try_allocate_page
                            ((basic_default_allocator<65536UL> *)this,i_progress_guarantee_00);
  }
  if (i_atomic_00 == (__pointer_type)0x0) {
    i_atomic_00 = (__pointer_type)0x0;
  }
  else {
    raw_atomic_store(&i_atomic_00->m_next,0,memory_order_seq_cst);
    i_atomic = (uintptr_t *)this->m_tail;
    if (i_atomic == (uintptr_t *)0xffc0) {
      if ((this->m_initial_page)._M_b._M_p != (__pointer_type)0x0) {
        density_tests::detail::assert_failed<>
                  ("m_initial_page.load() == nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_single.h"
                   ,0x151);
      }
      LOCK();
      (this->m_initial_page)._M_b._M_p = i_atomic_00;
      UNLOCK();
    }
    else {
      if ((uintptr_t *)((ulong)i_atomic & 0xffffffffffff0000 | 0xfff0) < i_atomic + 1) {
        density_tests::detail::assert_failed<>
                  ("m_tail + sizeof(ControlBlock) <= uint_lower_align(m_tail, ALLOCATOR_TYPE::page_alignment) + ALLOCATOR_TYPE::page_size"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_single.h"
                   ,0x15c);
      }
      raw_atomic_store(i_atomic,(ulong)i_atomic_00 | 2,memory_order_seq_cst);
    }
    this->m_tail = (uintptr_t)i_atomic_00;
  }
  return (uintptr_t)i_atomic_00;
}

Assistant:

DENSITY_NO_INLINE uintptr_t
                              page_overflow(LfQueue_ProgressGuarantee i_progress_guarantee)
            {
                auto const new_page = static_cast<ControlBlock *>(
                  i_progress_guarantee == LfQueue_Throwing
                    ? ALLOCATOR_TYPE::allocate_page()
                    : ALLOCATOR_TYPE::try_allocate_page(ToDenGuarantee(i_progress_guarantee)));
                DENSITY_ASSUME_ALIGNED(new_page, ALLOCATOR_TYPE::page_alignment);
                if (new_page == nullptr)
                {
                    // allocation failed
                    return 0;
                }

                // zero the first block of the new page
                raw_atomic_store(&new_page->m_next, uintptr_t(0), mem_relaxed);

                if (m_tail == s_invalid_control_block)
                {
                    /* virgin queue: this happens only once in the entire lifetime of the queue */
                    DENSITY_ASSERT_INTERNAL(m_initial_page.load() == nullptr);
                    m_initial_page.store(new_page, mem_release);
                }
                else
                {
                    /* Setup a dead block with the pointer to the new page. Unlike the multiple-producer cases,
                        this block is not allocated at a fixed position, and no padding dead blocks are necessary. */
                    auto const prev_block = reinterpret_cast<ControlBlock *>(m_tail);
                    DENSITY_ASSERT_INTERNAL(
                      m_tail + sizeof(ControlBlock) <=
                      uint_lower_align(m_tail, ALLOCATOR_TYPE::page_alignment) +
                        ALLOCATOR_TYPE::page_size);
                    raw_atomic_store(
                      &prev_block->m_next,
                      reinterpret_cast<uintptr_t>(new_page) + LfQueue_Dead,
                      mem_release);
                }

                // done
                m_tail = reinterpret_cast<uintptr_t>(new_page);
                return m_tail;
            }